

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int emit_goto(JSParseState *s,int opcode,int label)

{
  BOOL BVar1;
  LabelSlot *pLVar2;
  int in_EDX;
  uint32_t in_ESI;
  JSParseState *in_RDI;
  undefined4 in_stack_fffffffffffffffc;
  uint8_t val;
  
  val = (uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18);
  BVar1 = js_is_live_code((JSParseState *)CONCAT44(in_ESI,in_EDX));
  if (BVar1 == 0) {
    in_EDX = -1;
  }
  else {
    if (in_EDX < 0) {
      in_EDX = new_label((JSParseState *)0x1939ff);
    }
    emit_op((JSParseState *)CONCAT44(opcode,label),val);
    emit_u32(in_RDI,in_ESI);
    pLVar2 = in_RDI->cur_func->label_slots + in_EDX;
    pLVar2->ref_count = pLVar2->ref_count + 1;
  }
  return in_EDX;
}

Assistant:

static int emit_goto(JSParseState *s, int opcode, int label)
{
    if (js_is_live_code(s)) {
        if (label < 0)
            label = new_label(s);
        emit_op(s, opcode);
        emit_u32(s, label);
        s->cur_func->label_slots[label].ref_count++;
        return label;
    }
    return -1;
}